

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O3

JavascriptString *
Js::DateImplementation::GetDateDefaultString
          (YMD *pymd,TZD *ptzd,DateTimeFlag noDateTime,ScriptContext *scriptContext)

{
  short sVar1;
  CompoundString *toString;
  char16 *s;
  YMD *pYVar2;
  int iVar3;
  CharCount local_38 [2];
  int positiveYear;
  
  toString = CompoundString::NewWithCharCapacity
                       (0x48,(scriptContext->super_ScriptContextBase).javascriptLibrary);
  if ((noDateTime._value & 2) == 0) {
    CompoundString::AppendGeneric<4u,Js::CompoundString>
              ((char16 (*) [4])(g_rgpszDay + (long)pymd->wday * 8),true,toString,true);
    CompoundString::AppendChars(toString,L' ');
    CompoundString::AppendGeneric<4u,Js::CompoundString>
              ((char16 (*) [4])(g_rgpszMonth + (long)pymd->mon * 8),true,toString,true);
    CompoundString::AppendChars(toString,L' ');
    local_38[0] = CONCAT22(local_38[0]._2_2_,(short)pymd->mday + 1);
    CompoundString::
    AppendChars<unsigned_short,Js::DateImplementation::GetDateDefaultString<Js::CompoundString,Js::ScriptContext,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0>(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0)::_lambda(unsigned_short,char16_t*,unsigned_int)_1_>
              (toString);
    CompoundString::AppendChars(toString,L' ');
    pYVar2 = pymd;
    if (pymd->year < 1) {
      local_38[0] = -pymd->year;
      CompoundString::AppendChars(toString,L'-');
      pYVar2 = (YMD *)local_38;
    }
    CompoundString::AppendChars<int,Js::__4>(toString,pYVar2);
    if ((noDateTime._value & 1) != 0) {
      return (JavascriptString *)toString;
    }
    CompoundString::AppendChars(toString,L' ');
  }
  else if ((noDateTime._value & 1) != 0) {
    return (JavascriptString *)toString;
  }
  local_38[0]._0_2_ = (short)(pymd->time / 3600000);
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateDefaultString<Js::CompoundString,Js::ScriptContext,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0>(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0)::_lambda(unsigned_short,char16_t*,unsigned_int)_1_>
            (toString,local_38);
  CompoundString::AppendChars(toString,L':');
  iVar3 = pymd->time / 60000;
  local_38[0]._0_2_ =
       (short)iVar3 +
       ((short)(uint)((ulong)((long)iVar3 * 0x88888889) >> 0x25) - (short)(iVar3 >> 0x1f)) * -0x3c;
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateDefaultString<Js::CompoundString,Js::ScriptContext,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0>(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0)::_lambda(unsigned_short,char16_t*,unsigned_int)_1_>
            (toString,local_38);
  CompoundString::AppendChars(toString,L':');
  iVar3 = pymd->time / 1000;
  local_38[0] = CONCAT22(local_38[0]._2_2_,
                         (short)iVar3 +
                         ((short)(uint)((ulong)((long)iVar3 * 0x88888889) >> 0x25) -
                         (short)(iVar3 >> 0x1f)) * -0x3c);
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateDefaultString<Js::CompoundString,Js::ScriptContext,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0>(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0)::_lambda(unsigned_short,char16_t*,unsigned_int)_1_>
            (toString,local_38);
  CompoundString::AppendGeneric<5u,Js::CompoundString>((char16 (*) [5])L" GMT",true,toString,true);
  iVar3 = ptzd->offset;
  if (iVar3 < 0) {
    CompoundString::AppendChars(toString,L'-');
    iVar3 = -iVar3;
  }
  else {
    CompoundString::AppendChars(toString,L'+');
  }
  sVar1 = (short)(iVar3 / 0x3c);
  local_38[0]._0_2_ = sVar1;
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateDefaultString<Js::CompoundString,Js::ScriptContext,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0>(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0)::_lambda(unsigned_short,char16_t*,unsigned_int)_1_>
            (toString,local_38);
  local_38[0] = CONCAT22(local_38[0]._2_2_,(short)iVar3 + sVar1 * -0x3c);
  CompoundString::
  AppendChars<unsigned_short,Js::DateImplementation::GetDateDefaultString<Js::CompoundString,Js::ScriptContext,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0>(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*,Js::DateImplementation::GetDateDefaultString(PlatformAgnostic::DateTime::YMD*,Js::DateImplementation::TZD*,Js::DateImplementation::DateTimeFlag,Js::ScriptContext*)::__0)::_lambda(unsigned_short,char16_t*,unsigned_int)_1_>
            (toString,local_38);
  CompoundString::AppendGeneric<3u,Js::CompoundString>((char16 (*) [3])0x10da1e8,true,toString,true)
  ;
  if (ptzd->fDst == false) {
    s = PlatformAgnostic::DateTime::Utility::GetStandardName
                  (&scriptContext->dateTimeUtility,(size_t *)local_38,pymd);
  }
  else {
    s = PlatformAgnostic::DateTime::Utility::GetDaylightName
                  (&scriptContext->dateTimeUtility,(size_t *)local_38,pymd);
  }
  CompoundString::AppendChars(toString,s,local_38[0]);
  CompoundString::AppendChars(toString,L')');
  return (JavascriptString *)toString;
}

Assistant:

JavascriptString*
    DateImplementation::GetDateDefaultString(DateTime::YMD *pymd, TZD *ptzd,DateTimeFlag noDateTime,ScriptContext* scriptContext)
    {
        return GetDateDefaultString<CompoundString>(pymd, ptzd, noDateTime, scriptContext,
            [=](CharCount capacity) -> CompoundString*
        {
            return CompoundString::NewWithCharCapacity(capacity, scriptContext->GetLibrary());
        });
    }